

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

void __thiscall iDynTree::XMLParser::XMLParserPimpl::XMLParserPimpl(XMLParserPimpl *this)

{
  function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *in_RDI;
  
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,std::deque<std::shared_ptr<iDynTree::XMLElement>,std::allocator<std::shared_ptr<iDynTree::XMLElement>>>>
  ::
  stack<std::deque<std::shared_ptr<iDynTree::XMLElement>,std::allocator<std::shared_ptr<iDynTree::XMLElement>>>,void>
            ((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
              *)in_RDI);
  std::function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>::function
            (in_RDI);
  std::shared_ptr<iDynTree::XMLDocument>::shared_ptr((shared_ptr<iDynTree::XMLDocument> *)0x12a5c1);
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12a5e3);
  XMLParserState::XMLParserState((XMLParserState *)0x12a5f4);
  memset(in_RDI,0,0x100);
  *(undefined4 *)&in_RDI[6]._M_invoker = 0xdeedbeaf;
  *(code **)((long)&in_RDI[7].super__Function_base._M_functor + 8) = parserCallbackStartTag;
  in_RDI[7].super__Function_base._M_manager = parserCallbackEndTag;
  *(code **)&in_RDI[3].super__Function_base._M_functor = parserCallbackStartDocument;
  *(code **)((long)&in_RDI[3].super__Function_base._M_functor + 8) = parserCallbackEndDocument;
  *(code **)((long)&in_RDI[4].super__Function_base._M_functor + 8) = parserCallbackCharacters;
  in_RDI[5].super__Function_base._M_manager = parserErrorMessageCallback;
  *(code **)((long)&in_RDI[5].super__Function_base._M_functor + 8) = parserWarningMessageCallback;
  return;
}

Assistant:

XMLParserPimpl() {
            // ???: SAX2 structure initialization is kept in PIMPL constructor
            // All the other initializations are left to the main class
            
            // xmlSAX2InitDefaultSAXHandler(&m_callbackHandler, 0);
            // xmlSAXVersion(&m_callbackHandler, 2);
            // TODO: check what init does as the program crashes in that case
            // I think it initialize some callbacks that are missing
            memset(&m_callbackHandler, 0, sizeof(xmlSAXHandler));
            m_callbackHandler.initialized = XML_SAX2_MAGIC;
            
            m_callbackHandler.startElementNs = &parserCallbackStartTag;
            m_callbackHandler.endElementNs = &parserCallbackEndTag;
            m_callbackHandler.startDocument = &parserCallbackStartDocument;
            m_callbackHandler.endDocument = &parserCallbackEndDocument;
            m_callbackHandler.characters = &parserCallbackCharacters;
            m_callbackHandler.error = &parserErrorMessageCallback;
            m_callbackHandler.warning = &parserWarningMessageCallback;

        }